

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
I2sSimulationDataGenerator::GenerateSimulationData
          (I2sSimulationDataGenerator *this,U64 newest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  uint uVar1;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  uint uVar6;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (newest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar4 < uVar3) {
    uVar6 = (int)this + 0x10;
    do {
      GetNextAudioBit(this);
      uVar1 = this->mCurrentFrameBitIndex + 1;
      if ((ulong)((long)(this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mFrameBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)uVar1) {
        uVar1 = 0;
      }
      this->mCurrentFrameBitIndex = uVar1;
      ClockGenerator::AdvanceByHalfPeriod(1.0);
      SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
      SimulationChannelDescriptor::Transition();
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mFrame);
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mData);
      ClockGenerator::AdvanceByHalfPeriod(1.0);
      SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
      SimulationChannelDescriptor::Transition();
      uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    } while (uVar4 < uVar3);
  }
  pSVar5 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar5;
  UVar2 = SimulationChannelDescriptorGroup::GetCount();
  return UVar2;
}

Assistant:

U32 I2sSimulationDataGenerator::GenerateSimulationData( U64 newest_sample_requested, U32 sample_rate,
                                                        SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( newest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mData->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        WriteBit( GetNextAudioBit(), GetNextFrameBit() );
    }

    *simulation_channels = mSimulationChannels.GetArray();
    return mSimulationChannels.GetCount();
}